

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O1

_Bool tool_create_output_file(OutStruct *outs,OperationConfig *config)

{
  char *__filename;
  GlobalConfig *config_00;
  bool bVar1;
  int __fd;
  int *piVar2;
  size_t __n;
  FILE *pFVar3;
  char *pcVar4;
  uint uVar5;
  
  __filename = outs->filename;
  config_00 = config->global;
  if ((config->file_clobber_mode == CLOBBER_ALWAYS) ||
     ((config->file_clobber_mode == CLOBBER_DEFAULT && (outs->is_cd_filename != true)))) {
    pFVar3 = fopen64(__filename,"wb");
    goto LAB_0010c5c6;
  }
  do {
    __fd = open64(__filename,0xc1,0x1b6);
    if (__fd != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if ((__fd == -1) && (config->file_clobber_mode == CLOBBER_NEVER)) {
    __n = strlen(__filename);
    if (__n < 0xfffffffffffffff3) {
      pcVar4 = (char *)malloc(__n + 0xd);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "out of memory";
        goto LAB_0010c57f;
      }
      memcpy(pcVar4,__filename,__n);
      pcVar4[__n] = '.';
      piVar2 = __errno_location();
      uVar5 = 1;
      __fd = -1;
      while (((*piVar2 == 0x11 || (*piVar2 == 0x15)) && (uVar5 < 100))) {
        curl_msnprintf(pcVar4 + __n + 1,0xc,"%d",uVar5);
        uVar5 = uVar5 + 1;
        do {
          __fd = open64(pcVar4,0xc1,0x1b6);
          if (__fd != -1) goto LAB_0010c566;
        } while (*piVar2 == 4);
      }
LAB_0010c566:
      outs->filename = pcVar4;
      outs->alloc_filename = true;
      bVar1 = true;
    }
    else {
      pcVar4 = "overflow in filename generation";
LAB_0010c57f:
      bVar1 = false;
      errorf(config_00,pcVar4);
      __fd = -1;
    }
    if (bVar1) goto LAB_0010c596;
    pFVar3 = (FILE *)0x0;
    bVar1 = false;
  }
  else {
LAB_0010c596:
    bVar1 = true;
    if (__fd != -1) {
      pFVar3 = fdopen(__fd,"wb");
      if (pFVar3 != (FILE *)0x0) goto LAB_0010c5c1;
      close(__fd);
    }
    pFVar3 = (FILE *)0x0;
  }
LAB_0010c5c1:
  if (!bVar1) {
    return false;
  }
LAB_0010c5c6:
  if (pFVar3 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar4 = strerror(*piVar2);
    warnf(config_00,"Failed to open the file %s: %s",__filename,pcVar4);
  }
  else {
    outs->s_isreg = true;
    outs->fopened = true;
    outs->stream = (FILE *)pFVar3;
    outs->bytes = 0;
    outs->init = 0;
  }
  return pFVar3 != (FILE *)0x0;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs,
                             struct OperationConfig *config)
{
  struct GlobalConfig *global;
  FILE *file = NULL;
  const char *fname = outs->filename;
  DEBUGASSERT(outs);
  DEBUGASSERT(config);
  global = config->global;
  DEBUGASSERT(fname && *fname);

  if(config->file_clobber_mode == CLOBBER_ALWAYS ||
     (config->file_clobber_mode == CLOBBER_DEFAULT &&
      !outs->is_cd_filename)) {
    /* open file for writing */
    file = fopen(fname, "wb");
  }
  else {
    int fd;
    do {
      fd = open(fname, O_CREAT | O_WRONLY | O_EXCL | O_BINARY, OPENMODE);
      /* Keep retrying in the hope that it is not interrupted sometime */
    } while(fd == -1 && errno == EINTR);
    if(config->file_clobber_mode == CLOBBER_NEVER && fd == -1) {
      int next_num = 1;
      size_t len = strlen(fname);
      size_t newlen = len + 13; /* nul + 1-11 digits + dot */
      char *newname;
      /* Guard against wraparound in new filename */
      if(newlen < len) {
        errorf(global, "overflow in filename generation");
        return FALSE;
      }
      newname = malloc(newlen);
      if(!newname) {
        errorf(global, "out of memory");
        return FALSE;
      }
      memcpy(newname, fname, len);
      newname[len] = '.';
      while(fd == -1 && /* have not successfully opened a file */
            (errno == EEXIST || errno == EISDIR) &&
            /* because we keep having files that already exist */
            next_num < 100 /* and we have not reached the retry limit */ ) {
        msnprintf(newname + len + 1, 12, "%d", next_num);
        next_num++;
        do {
          fd = open(newname, O_CREAT | O_WRONLY | O_EXCL | O_BINARY, OPENMODE);
          /* Keep retrying in the hope that it is not interrupted sometime */
        } while(fd == -1 && errno == EINTR);
      }
      outs->filename = newname; /* remember the new one */
      outs->alloc_filename = TRUE;
    }
    /* An else statement to not overwrite existing files and not retry with
       new numbered names (which would cover
       config->file_clobber_mode == CLOBBER_DEFAULT && outs->is_cd_filename)
       is not needed because we would have failed earlier, in the while loop
       and `fd` would now be -1 */
    if(fd != -1) {
      file = fdopen(fd, "wb");
      if(!file)
        close(fd);
    }
  }

  if(!file) {
    warnf(global, "Failed to open the file %s: %s", fname,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}